

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

void __thiscall rcg::Stream::stopStreaming(Stream *this)

{
  bool bVar1;
  GC_ERROR GVar2;
  int iVar3;
  element_type *peVar4;
  ICommand *pIVar5;
  element_type *peVar6;
  undefined4 extraout_var;
  long in_RDI;
  IInteger *pi;
  shared_ptr<GenApi_3_4::CNodeMapRef> nmap;
  BUFFER_HANDLE p;
  size_t i;
  CCommandPtr stop;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  IBase *in_stack_fffffffffffffe98;
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *in_stack_fffffffffffffea0;
  long *local_150;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  Buffer *in_stack_fffffffffffffed0;
  gcstring local_108 [56];
  char *in_stack_ffffffffffffff30;
  Device *in_stack_ffffffffffffff38;
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> *in_stack_ffffffffffffff50;
  BUFFER_HANDLE local_a0;
  ulong local_98;
  gcstring local_90 [96];
  CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase> local_30 [3];
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88
            );
  if (*(long *)(in_RDI + 0xe0) != 0) {
    Buffer::setHandle(in_stack_fffffffffffffed0,
                      (void *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1214f5);
    Device::getRemoteNodeMap(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    peVar4 = std::
             __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x121518);
    GenICam_3_4::gcstring::gcstring(local_90,"AcquisitionStop");
    (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
      super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_90);
    GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::CPointer
              (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    GenICam_3_4::gcstring::~gcstring(local_90);
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1215a1);
    pIVar5 = GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::operator->
                       (in_stack_ffffffffffffff50);
    (**(code **)(*(long *)pIVar5 + 0x38))();
    peVar6 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1215d8);
    (*peVar6->DSStopAcquisition)(*(DS_HANDLE *)(in_RDI + 0xd0),0);
    peVar6 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1215ff);
    (*peVar6->GCUnregisterEvent)(*(EVENTSRC_HANDLE *)(in_RDI + 0xd0),1);
    peVar6 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x121626);
    (*peVar6->DSFlushQueue)(*(DS_HANDLE *)(in_RDI + 0xd0),4);
    for (local_98 = 0; local_98 < *(ulong *)(in_RDI + 0xe0); local_98 = local_98 + 1) {
      local_a0 = (BUFFER_HANDLE)0x0;
      peVar6 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x121682);
      GVar2 = (*peVar6->DSGetBufferID)(*(DS_HANDLE *)(in_RDI + 0xd0),0,&local_a0);
      if (GVar2 == 0) {
        peVar6 = std::
                 __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1216c2);
        (*peVar6->DSRevokeBuffer)(*(DS_HANDLE *)(in_RDI + 0xd0),local_a0,(void **)0x0,(void **)0x0);
      }
    }
    *(undefined8 *)(in_RDI + 0xd8) = 0;
    *(undefined8 *)(in_RDI + 0xe0) = 0;
    std::__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<rcg::Device,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1217a2);
    Device::getRemoteNodeMap(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
    peVar4 = std::
             __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1217c5);
    GenICam_3_4::gcstring::gcstring(local_108,"TLParamsLocked");
    iVar3 = (*(peVar4->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
              super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar4,local_108);
    if (CONCAT44(extraout_var,iVar3) == 0) {
      local_150 = (long *)0x0;
    }
    else {
      local_150 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar3),&GenApi_3_4::INode::typeinfo,
                                         &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    }
    GenICam_3_4::gcstring::~gcstring(local_108);
    bVar1 = GenApi_3_4::IsWritable
                      ((IBase *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
    if (bVar1) {
      (**(code **)(*local_150 + 0x38))(local_150,0,1);
    }
    std::shared_ptr<GenApi_3_4::CNodeMapRef>::~shared_ptr
              ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x1218fe);
    GenApi_3_4::CPointer<GenApi_3_4::ICommand,_GenApi_3_4::IBase>::~CPointer(local_30);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x121936);
  return;
}

Assistant:

void Stream::stopStreaming()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (bn > 0)
  {
    buffer.setHandle(0);

    // do not throw exceptions as this method is also called in destructor

    GenApi::CCommandPtr stop=parent->getRemoteNodeMap()->_GetNode("AcquisitionStop");
    stop->Execute();

    gentl->DSStopAcquisition(stream, GenTL::ACQ_STOP_FLAGS_DEFAULT);
    gentl->GCUnregisterEvent(stream, GenTL::EVENT_NEW_BUFFER);
    gentl->DSFlushQueue(stream, GenTL::ACQ_QUEUE_ALL_DISCARD);

    // free all buffers

    for (size_t i=0; i<bn; i++)
    {
      GenTL::BUFFER_HANDLE p=0;
      if (gentl->DSGetBufferID(stream, 0, &p) == GenTL::GC_ERR_SUCCESS)
      {
        gentl->DSRevokeBuffer(stream, p, 0, 0);
      }
    }

    event=0;
    bn=0;

    // unlock parameters

    std::shared_ptr<GenApi::CNodeMapRef> nmap=parent->getRemoteNodeMap();
    GenApi::IInteger *pi=dynamic_cast<GenApi::IInteger *>(nmap->_GetNode("TLParamsLocked"));

    if (GenApi::IsWritable(pi))
    {
      pi->SetValue(0);
    }
  }
}